

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *m,uint param_3)

{
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  body;
  allocator local_109;
  string local_108;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_> local_48;
  
  std::__cxx11::string::string((string *)&local_108,"items",&local_109);
  local_48.xx.first = 0;
  local_48.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.it._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48.ct = m;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp(&local_98,&local_108,&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_48.xx.second.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&local_108);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp(&local_e8,&local_98);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_e8);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp(&local_e8);
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp(&local_98);
  return;
}

Assistant:

void hibernate(A& ar, std::map<Key,Data>& m, const unsigned int)
{
	typedef std::pair<Key,Data> ElType;
	collection_nvp<ElType,stl_map_adapter<Key,Data> >
			body( "items", stl_map_adapter<Key,Data>(m) );
	ar & body;
}